

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiddle~.c
# Opt level: O0

void sigfiddle_bang(t_sigfiddle *x)

{
  int iVar1;
  undefined1 local_88 [8];
  t_atom at_1 [2];
  t_atom at [3];
  t_peakout *po;
  t_pitchhist *ptStack_20;
  int npeakout;
  t_pitchhist *ph;
  int i;
  t_sigfiddle *x_local;
  
  if (x->x_npeakout != 0) {
    iVar1 = x->x_npeakout;
    for (ph._4_4_ = 0; ph._4_4_ < iVar1; ph._4_4_ = ph._4_4_ + 1) {
      at_1[1].a_w.w_float = 1.4013e-45;
      outlet_list((_outlet *)x->x_peakout,(t_symbol *)0x0,3,(t_atom *)&at_1[1].a_w);
    }
  }
  outlet_float((_outlet *)x->x_envout,x->x_dbs[x->x_histphase]);
  ptStack_20 = x->x_hist;
  for (ph._4_4_ = 0; ph._4_4_ < x->x_npitch; ph._4_4_ = ph._4_4_ + 1) {
    local_88._0_4_ = A_FLOAT;
    at_1[0].a_type = (t_atomtype)ptStack_20->h_pitches[x->x_histphase];
    at_1[0].a_w.w_float = 1.4013e-45;
    at_1[1].a_type = (t_atomtype)ptStack_20->h_amps[x->x_histphase];
    outlet_list((_outlet *)ptStack_20->h_outlet,(t_symbol *)0x0,2,(t_atom *)local_88);
    ptStack_20 = ptStack_20 + 1;
  }
  if (x->x_attackvalue != 0) {
    outlet_bang((_outlet *)x->x_attackout);
  }
  ptStack_20 = x->x_hist;
  for (ph._4_4_ = 0; ph._4_4_ < x->x_npitch; ph._4_4_ = ph._4_4_ + 1) {
    if ((ptStack_20->h_pitch != 0.0) || (NAN(ptStack_20->h_pitch))) {
      outlet_float((_outlet *)x->x_noteout,ptStack_20->h_pitch);
    }
    ptStack_20 = ptStack_20 + 1;
  }
  return;
}

Assistant:

void sigfiddle_bang(t_sigfiddle *x)
{
    int i;
    t_pitchhist *ph;
    if (x->x_npeakout)
    {
        int npeakout = x->x_npeakout;
        t_peakout *po;
        for (i = 0, po = x->x_peakbuf; i < npeakout; i++, po++)
        {
            t_atom at[3];
            SETFLOAT(at, i+1);
            SETFLOAT(at+1, po->po_freq);
            SETFLOAT(at+2, po->po_amp);
            outlet_list(x->x_peakout, 0, 3, at);
        }
    }
    outlet_float(x->x_envout, x->x_dbs[x->x_histphase]);
    for (i = 0,  ph = x->x_hist; i < x->x_npitch; i++,  ph++)
    {
        t_atom at[2];
        SETFLOAT(at, ph->h_pitches[x->x_histphase]);
        SETFLOAT(at+1, ph->h_amps[x->x_histphase]);
        outlet_list(ph->h_outlet, 0, 2, at);
    }
    if (x->x_attackvalue) outlet_bang(x->x_attackout);
    for (i = 0,  ph = x->x_hist; i < x->x_npitch; i++,  ph++)
        if (ph->h_pitch) outlet_float(x->x_noteout, ph->h_pitch);
}